

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O2

void __thiscall bgui::anon_unknown_0::X11Exception::X11Exception(X11Exception *this,string *message)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"X11",&local_39);
  gutil::Exception::Exception(&this->super_Exception,&local_38,message);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00162368;
  return;
}

Assistant:

X11Exception(const std::string &message) :
      gutil::Exception("X11", message) { }